

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_staircase(chunk_conflict *c,loc centre,wchar_t rating)

{
  connector *pcVar1;
  loc_conflict grid;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  wchar_t by1_00;
  wchar_t bx1_00;
  wchar_t by2_00;
  wchar_t bx2_00;
  loc top_left;
  loc bottom_right;
  loc local_68;
  loc rg;
  wchar_t bx2;
  wchar_t by2;
  wchar_t bx1;
  wchar_t by1;
  loc br;
  loc tl;
  connector *join;
  wchar_t rating_local;
  chunk_conflict *c_local;
  wchar_t wStack_10;
  loc centre_local;
  
  pcVar1 = dun->curr_join;
  if (pcVar1 == (connector *)0x0) {
    quit_fmt("build_staircase() called without dun->curr_join set");
  }
  wStack_10 = centre.y;
  if ((wStack_10 < c->height) && (c_local._4_4_ = centre.x, c_local._4_4_ < c->width)) {
    centre_local.x._3_1_ = false;
  }
  else {
    grid = pcVar1->grid;
    wStack_10 = grid.y;
    if ((wStack_10 < L'\x01') ||
       (((c->height + L'\xfffffffe' < wStack_10 || (c_local._4_4_ = grid.x, c_local._4_4_ < L'\x01')
         ) || (c->width + L'\xfffffffe' < c_local._4_4_)))) {
      centre_local.x._3_1_ = false;
    }
    else {
      iVar3 = 1;
      if (L'\x01' < c_local._4_4_) {
        iVar3 = 2;
      }
      iVar4 = 1;
      if (L'\x01' < wStack_10) {
        iVar4 = 2;
      }
      top_left = loc(c_local._4_4_ - iVar3,wStack_10 - iVar4);
      iVar3 = 1;
      if (c_local._4_4_ < c->width + L'\xfffffffe') {
        iVar3 = 2;
      }
      iVar4 = 1;
      if (wStack_10 < c->height + L'\xfffffffe') {
        iVar4 = 2;
      }
      bottom_right = loc(c_local._4_4_ + iVar3,wStack_10 + iVar4);
      by1 = bottom_right.y;
      br.y = top_left.y;
      bx1 = bottom_right.x;
      br.x = top_left.x;
      rg = bottom_right;
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,(by1 - br.y) + L'\x01',(bx1 - br.x) + L'\x01');
      by1_00 = br.y / dun->block_hgt;
      bx1_00 = br.x / dun->block_wid;
      by2_00 = by1 / dun->block_hgt;
      bx2_00 = bx1 / dun->block_wid;
      if ((dun->block_hgt < L'\x02') && (dun->block_wid < L'\x02')) {
        _Var2 = check_for_unreserved_blocks(by1_00,bx1_00,by2_00,bx2_00);
        if (!_Var2) {
          return false;
        }
      }
      else {
        _Var2 = cave_find_in_range(c,&local_68,top_left,bottom_right,square_isroom);
        if (_Var2) {
          return false;
        }
      }
      reserve_blocks(by1_00,bx1_00,by2_00,bx2_00);
      if (dun->cent_n < (int)(uint)z_info->level_room_max) {
        dun->cent[dun->cent_n] = grid;
        dun->cent_n = dun->cent_n + L'\x01';
      }
      generate_room(c,wStack_10 + L'\xffffffff',c_local._4_4_ + L'\xffffffff',wStack_10 + L'\x01',
                    c_local._4_4_ + L'\x01',L'\0');
      draw_rectangle(c,wStack_10 + L'\xffffffff',c_local._4_4_ + L'\xffffffff',wStack_10 + L'\x01',
                     c_local._4_4_ + L'\x01',L'\x15',L'\f',false);
      square_set_feat((chunk *)c,grid,(uint)pcVar1->feat);
      centre_local.x._3_1_ = true;
    }
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_staircase(struct chunk *c, struct loc centre, int rating)
{
	struct connector *join = dun->curr_join;

	if (!join) {
		quit_fmt("build_staircase() called without dun->curr_join set");
	}

	if (centre.y >= c->height || centre.x >= c->width) {
		/*
		 * Verify that there's space for the 1 x 1 room at the
		 * staircase location (3 x 3 including the walls; if not at
		 * an edge also want a one grid buffer around the walls so
		 * the wall piercings for tunneling will work).
		 */
		struct loc tl, br;
		int by1, bx1, by2, bx2;

		centre = join->grid;
		if (centre.y < 1 || centre.y > c->height - 2 || centre.x < 1 ||
			centre.x > c->width - 2) return false;
		tl = loc(centre.x - ((centre.x > 1) ? 2 : 1),
			centre.y - ((centre.y > 1) ? 2 : 1));
		br = loc(centre.x + ((centre.x < c->width - 2) ? 2 : 1),
			centre.y + ((centre.y < c->height - 2) ? 2 : 1));
		event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
			br.y - tl.y + 1, br.x - tl.x + 1);
		by1 = tl.y / dun->block_hgt;
		bx1 = tl.x / dun->block_wid;
		by2 = br.y / dun->block_hgt;
		bx2 = br.x / dun->block_wid;
		/*
		 * If the block size is greater than one, look for room flags
		 * rather than check the block map.  It's less efficient, but
		 * gives a better chance of success since multiple staircase
		 * rooms could be placed in a block if they're far enough apart.
		 */
		if (dun->block_hgt > 1 || dun->block_wid > 1) {
			struct loc rg;

			if (cave_find_in_range(c, &rg, tl, br, square_isroom))
				return false;
		} else if (!check_for_unreserved_blocks(by1, bx1, by2, bx2)) {
			return false;
		}

		reserve_blocks(by1, bx1, by2, bx2);

		/* Save the room location */
		if (dun->cent_n < z_info->level_room_max) {
			dun->cent[dun->cent_n] = centre;
			dun->cent_n++;
		}
	} else {
		/* Never works for the caller to set the location. */
		return false;
	}

	/* Generate new room and outer walls */
	generate_room(c, centre.y - 1, centre.x - 1, centre.y + 1, centre.x + 1,
				  false);
	draw_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1, centre.x + 1,
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Place the correct stair */
	square_set_feat(c, centre, join->feat);

	/* Success */
	return true;
}